

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateDecay(Operator *this,Chip *chip)

{
  byte bVar1;
  Bit8u val;
  Bit8u rate;
  Chip *chip_local;
  Operator *this_local;
  
  bVar1 = this->reg60 & 0xf;
  if (bVar1 == 0) {
    this->decayAdd = 0;
    this->rateZero = this->rateZero | 8;
  }
  else {
    this->decayAdd = chip->linearRates[(byte)(bVar1 * '\x04' + this->ksr)];
    this->rateZero = this->rateZero & 0xf7;
  }
  return;
}

Assistant:

inline void Operator::UpdateDecay( const Chip* chip ) {
	Bit8u rate = reg60 & 0xf;
	if ( rate ) {
		Bit8u val = (rate << 2) + ksr;
		decayAdd = chip->linearRates[ val ];
		rateZero &= ~(1 << DECAY);
	} else {
		decayAdd = 0;
		rateZero |= (1 << DECAY);
	}
}